

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::splatF32x4(Literal *__return_storage_ptr__,Literal *this)

{
  long lVar1;
  Literal *this_00;
  undefined1 auStack_88 [8];
  LaneArray<4> lanes;
  
  if ((this->type).id == 4) {
    lanes._M_elems[3].field_0.i64 = 0;
    lanes._M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
    lanes._M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
    lanes._M_elems[2].type.id = 0;
    lanes._M_elems[1].type.id = 0;
    lanes._M_elems[2].field_0.i64 = 0;
    lanes._M_elems[1].field_0.i64 = 0;
    lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
    lanes._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
    lanes._M_elems[0].type.id = 0;
    auStack_88 = (undefined1  [8])0x0;
    lanes._M_elems[0].field_0.i64 = 0;
    lVar1 = 0;
    do {
      this_00 = (Literal *)((long)lanes._M_elems + lVar1 + -8);
      if (this_00 != this) {
        ~Literal(this_00);
        Literal(this_00,this);
      }
      lVar1 = lVar1 + 0x18;
    } while (lVar1 != 0x60);
    Literal(__return_storage_ptr__,(LaneArray<4> *)auStack_88);
    lVar1 = 0x48;
    do {
      ~Literal((Literal *)((long)lanes._M_elems + lVar1 + -8));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Ty",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x683,"Literal wasm::splat(const Literal &) [Ty = wasm::Type::f32, Lanes = 4]");
}

Assistant:

Literal Literal::splatF32x4() const { return splat<Type::f32, 4>(*this); }